

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScsAddress.cpp
# Opt level: O1

void __thiscall Scs::Address::Address(Address *this,String *port,String *address)

{
  uint uVar1;
  char *__name;
  addrinfo hints;
  addrinfo local_38;
  
  this->m_address = (addrinfo *)0x0;
  local_38.ai_flags = 0;
  local_38.ai_protocol = 0;
  local_38.ai_canonname = (char *)0x0;
  local_38.ai_next = (addrinfo *)0x0;
  local_38.ai_addrlen = 0;
  local_38._20_4_ = 0;
  local_38.ai_addr = (sockaddr *)0x0;
  local_38.ai_family = 2;
  local_38.ai_socktype = 1;
  __name = (char *)address->_M_string_length;
  if (__name != (char *)0x0) {
    __name = (address->_M_dataplus)._M_p;
  }
  uVar1 = getaddrinfo(__name,(port->_M_dataplus)._M_p,&local_38,(addrinfo **)this);
  if (uVar1 != 0) {
    LogWriteLine("getaddrinfo failed: %d",(ulong)uVar1);
  }
  this->m_current = this->m_address;
  Log(this);
  return;
}

Assistant:

Address::Address(const String & port, const String & address)
{
	// Client setup

	// Set up structures
	m_address = NULL;
	addrinfo hints;
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_INET; // Note: Windows fails to connect if left unspecified
	hints.ai_socktype = SOCK_STREAM;
	//hints.ai_protocol = IPPROTO_TCP;

	// Resolve the local address (if required) and port to be used by the socket
	const char * addressStr = address.size() > 0 ? address.c_str() : nullptr;
	int result = getaddrinfo(addressStr, port.c_str(), &hints, &m_address);
	if (result != 0)
	{
		LogWriteLine("getaddrinfo failed: %d", result);
	}
	m_current = m_address;
	Log();
}